

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

size_t __thiscall Lodtalk::MethodAssembler::PushClosure::computeBetterSize(PushClosure *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  size_t sVar3;
  size_t sVar4;
  PushClosure *this_00;
  
  uVar1 = this->numCopied;
  uVar2 = this->numArgs;
  this_00 = this;
  sVar3 = InstructionNode::sizeofExtA
                    (&this->super_InstructionNode,
                     (long)(((int)(((uint)((int)uVar2 >> 0x1f) >> 0x1d) + uVar2) >> 3) +
                           ((int)(((uint)((int)uVar1 >> 0x1f) >> 0x1d) + uVar1) >> 3) * 0x10));
  sVar4 = InstructionNode::sizeofExtB
                    (&this_00->super_InstructionNode,
                     (long)(((int)(this->blockEnd->super_InstructionNode).lastPosition -
                            ((int)(this->super_InstructionNode).lastPosition +
                            (int)(this->super_InstructionNode).size)) / 0x100));
  return sVar4 + sVar3 + 3;
}

Assistant:

virtual size_t computeBetterSize()
	{
		return 3 + sizeofExtA(extendAValue()) + sizeofExtB(extendBValue());
	}